

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_wsh_extkey_derive_Test::TestBody(Descriptor_Parse_wsh_extkey_derive_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  char *in_R9;
  AssertHelper local_2620;
  Message local_2618;
  string local_2610;
  undefined1 local_25f0 [8];
  AssertionResult gtest_ar_22;
  Message local_25d8;
  string local_25d0;
  undefined1 local_25b0 [8];
  AssertionResult gtest_ar_21;
  Message local_2598;
  int local_258c;
  size_type local_2588;
  undefined1 local_2580 [8];
  AssertionResult gtest_ar_20;
  undefined1 local_2220 [8];
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addresses;
  Message local_2200;
  string local_21f8;
  undefined1 local_21d8 [8];
  AssertionResult gtest_ar_19;
  undefined1 local_1e78 [8];
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  keys_1;
  Message local_1e58;
  Script local_1e50;
  string local_1e18;
  undefined1 local_1df8 [8];
  AssertionResult gtest_ar_18;
  Message local_1de0;
  int local_1dd4;
  size_type local_1dd0;
  undefined1 local_1dc8 [8];
  AssertionResult gtest_ar_17;
  Message local_1db0;
  DescriptorKeyType local_1da8;
  DescriptorKeyType local_1da4;
  undefined1 local_1da0 [8];
  AssertionResult gtest_ar_16;
  Message local_1d88;
  ExtPubkey local_1d80;
  string local_1d10;
  undefined1 local_1cf0 [8];
  AssertionResult gtest_ar_15;
  Message local_1cd8;
  Pubkey local_1cd0;
  string local_1cb8;
  undefined1 local_1c98 [8];
  AssertionResult gtest_ar_14;
  Message local_1c80;
  string local_1c78;
  undefined1 local_1c58 [8];
  AssertionResult gtest_ar_13;
  Message local_1c40 [2];
  CfdException *anon_var_0_1;
  byte local_1bb1;
  char *pcStack_1bb0;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  AssertHelper local_1b88;
  Message local_1b80;
  bool local_1b71;
  undefined1 local_1b70 [8];
  AssertionResult gtest_ar__5;
  Message local_1b58;
  ExtPubkey local_1b50;
  string local_1ae0;
  undefined1 local_1ac0 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_1a90;
  Message local_1a88;
  bool local_1a79;
  undefined1 local_1a78 [8];
  AssertionResult gtest_ar__4;
  Message local_1a60;
  Pubkey local_1a58;
  string local_1a40;
  undefined1 local_1a20 [8];
  AssertionResult gtest_ar_11;
  undefined1 local_16c0 [8];
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_> keys
  ;
  Message local_16a0;
  int local_1694;
  DescriptorScriptReference local_1690;
  uint32_t local_133c;
  undefined1 local_1338 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_1308;
  Message local_1300;
  DescriptorScriptReference local_12f8;
  bool local_fa1;
  undefined1 local_fa0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_f70;
  Message local_f68;
  DescriptorScriptReference local_f60;
  bool local_c09;
  undefined1 local_c08 [8];
  AssertionResult gtest_ar__2;
  Message local_bf0;
  Script local_be8;
  string local_bb0;
  undefined1 local_b90 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_b60;
  Message local_b58;
  bool local_b49;
  undefined1 local_b48 [8];
  AssertionResult gtest_ar__1;
  Message local_b30;
  DescriptorScriptType local_b28;
  DescriptorScriptType local_b24;
  undefined1 local_b20 [8];
  AssertionResult gtest_ar_8;
  Message local_b08;
  HashType local_b00;
  HashType local_afc;
  undefined1 local_af8 [8];
  AssertionResult gtest_ar_7;
  Message local_ae0;
  AddressType local_ad8;
  AddressType local_ad4;
  undefined1 local_ad0 [8];
  AssertionResult gtest_ar_6;
  Message local_ab8;
  Address local_ab0;
  string local_938;
  undefined1 local_918 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_8e8;
  Message local_8e0;
  bool local_8d1;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar_;
  Message local_8b8;
  int local_8ac;
  size_type local_8a8;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar_4;
  Message local_888;
  string local_880;
  undefined1 local_860 [8];
  AssertionResult gtest_ar_3;
  Message local_848;
  string local_840;
  undefined1 local_820 [8];
  AssertionResult gtest_ar_2;
  Message local_808;
  undefined1 local_800 [8];
  AssertionResult gtest_ar_1;
  Message local_7e8;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_7e0;
  AssertHelper local_7c8;
  Message local_7c0;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_7b8;
  AssertHelper local_7a0;
  Message local_798;
  Script local_790;
  AssertHelper local_758;
  Message local_750;
  allocator local_741;
  string local_740;
  Script local_720;
  AssertHelper local_6e8;
  Message local_6e0;
  string local_6d8;
  AssertHelper local_6b8;
  Message local_6b0 [2];
  CfdException *anon_var_0;
  byte local_661;
  char *pcStack_660;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_650 [2];
  Descriptor local_640;
  allocator local_4d1;
  value_type local_4d0;
  allocator local_4a9;
  value_type local_4a8;
  allocator local_481;
  value_type local_480;
  allocator local_459;
  value_type local_458;
  undefined1 local_438 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list1;
  AssertionResult gtest_ar;
  CfdException *except;
  undefined1 local_278 [8];
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_list2;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_list;
  Script gen_script;
  string local_208 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  allocator local_31;
  undefined1 local_30 [8];
  string descriptor;
  Descriptor_Parse_wsh_extkey_derive_Test *this_local;
  
  descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "wsh(multi(1,xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/*,xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*))"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_208,"",
             (allocator *)
             ((long)&gen_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gen_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script
            ((Script *)
             &script_list.
              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
            *)&script_list2.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
            *)local_278);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&except,(string *)local_30,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&arg_list2.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_458,"0",&local_459);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&arg_list2.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_480,"0",&local_481);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&arg_list2.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_480);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a8,"0/44",&local_4a9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_438,&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d0,"0/44",&local_4d1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_438,&local_4d0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                (&local_640,(string *)local_30,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=
                ((Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_640);
      cfd::core::Descriptor::~Descriptor(&local_640);
    }
  }
  else {
    testing::Message::Message(local_650);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x20a,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,local_650);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(local_650);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff9a0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff9a0);
  if (bVar1) {
    local_661 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                ((Script *)&anon_var_0,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),(Script *)&anon_var_0);
      cfd::core::Script::~Script((Script *)&anon_var_0);
    }
    if ((local_661 & 1) == 0) {
      pcStack_660 = 
      "Expected: locking_script = desc.GetLockingScript() throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0034ab28;
    }
  }
  else {
LAB_0034ab28:
    testing::Message::Message(local_6b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x20b,pcStack_660);
    testing::internal::AssertHelper::operator=(&local_6b8,local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6b8);
    testing::Message::~Message(local_6b0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_6d8,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_208,(string *)&local_6d8);
      std::__cxx11::string::~string((string *)&local_6d8);
    }
  }
  else {
    testing::Message::Message(&local_6e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x20c,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_6e8,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper(&local_6e8);
    testing::Message::~Message(&local_6e0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_740,"0",&local_741);
      cfd::core::Descriptor::GetLockingScript
                (&local_720,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_740);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_720);
      cfd::core::Script::~Script(&local_720);
      std::__cxx11::string::~string((string *)&local_740);
      std::allocator<char>::~allocator((allocator<char> *)&local_741);
    }
  }
  else {
    testing::Message::Message(&local_750);
    testing::internal::AssertHelper::AssertHelper
              (&local_758,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x20d,
               "Expected: locking_script = desc.GetLockingScript(\"0\") doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_758,&local_750);
    testing::internal::AssertHelper::~AssertHelper(&local_758);
    testing::Message::~Message(&local_750);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_790,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_438);
      cfd::core::Script::operator=
                ((Script *)
                 &script_list.
                  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_790);
      cfd::core::Script::~Script(&local_790);
    }
  }
  else {
    testing::Message::Message(&local_798);
    testing::internal::AssertHelper::AssertHelper
              (&local_7a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x20e,
               "Expected: gen_script = desc.GetLockingScript(arg_list2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_7a0,&local_798);
    testing::internal::AssertHelper::~AssertHelper(&local_7a0);
    testing::Message::~Message(&local_798);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReferenceAll
                (&local_7b8,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&arg_list2.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::operator=((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                   *)&script_list2.
                      super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_7b8);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::~vector(&local_7b8);
    }
  }
  else {
    testing::Message::Message(&local_7c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_7c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x20f,
               "Expected: script_list = desc.GetReferenceAll(&arg_list1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_7c8,&local_7c0);
    testing::internal::AssertHelper::~AssertHelper(&local_7c8);
    testing::Message::~Message(&local_7c0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReferenceAll
                (&local_7e0,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_438);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::operator=((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                   *)local_278,&local_7e0);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::~vector(&local_7e0);
    }
  }
  else {
    testing::Message::Message(&local_7e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x210,
               "Expected: script_list2 = desc.GetReferenceAll(&arg_list2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_7e8);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_800,"desc_str.c_str()","descriptor.c_str()",pcVar2,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
  if (!bVar1) {
    testing::Message::Message(&local_808);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x211,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_808);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
  cfd::core::Script::ToString_abi_cxx11_(&local_840,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_820,"locking_script.ToString().c_str()",
             "\"0 64969d8cdca2aa0bb72cfe88427612878db98a5f07f9a7ec6ec87b85e9f9208b\"",pcVar2,
             "0 64969d8cdca2aa0bb72cfe88427612878db98a5f07f9a7ec6ec87b85e9f9208b");
  std::__cxx11::string::~string((string *)&local_840);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_820);
  if (!bVar1) {
    testing::Message::Message(&local_848);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_820);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x213,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_848);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_848);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
  cfd::core::Script::ToString_abi_cxx11_
            (&local_880,
             (Script *)
             &script_list.
              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_860,"gen_script.ToString().c_str()",
             "\"0 2070830c75de894b00286a87cbbb201aaec3487b5891dbf657c0500e11efa27d\"",pcVar2,
             "0 2070830c75de894b00286a87cbbb201aaec3487b5891dbf657c0500e11efa27d");
  std::__cxx11::string::~string((string *)&local_880);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_860);
  if (!bVar1) {
    testing::Message::Message(&local_888);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_860);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x215,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_888);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_860);
  local_8a8 = std::
              vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                      *)&script_list2.
                         super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_8ac = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_8a0,"script_list.size()","1",&local_8a8,&local_8ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar1) {
    testing::Message::Message(&local_8b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x217,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_8b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_8b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  sVar3 = std::
          vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
          ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)&script_list2.
                     super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar3 != 1) goto LAB_0034d741;
  pvVar4 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                         *)&script_list2.
                            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_8d1 = cfd::core::DescriptorScriptReference::HasAddress(pvVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8d0,&local_8d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar1) {
    testing::Message::Message(&local_8e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5.message_,(internal *)local_8d0,
               (AssertionResult *)"script_list[0].HasAddress()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x219,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8e8,&local_8e0);
    testing::internal::AssertHelper::~AssertHelper(&local_8e8);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_8e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  pvVar4 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                         *)&script_list2.
                            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  cfd::core::DescriptorScriptReference::GenerateAddress(&local_ab0,pvVar4,kMainnet);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_938,&local_ab0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_918,
             "script_list[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str()",
             "\"bc1qvjtfmrxu524qhdevl6yyyasjs7xmnzjlqlu60mrwepact60eyz9s9xjw0c\"",pcVar2,
             "bc1qvjtfmrxu524qhdevl6yyyasjs7xmnzjlqlu60mrwepact60eyz9s9xjw0c");
  std::__cxx11::string::~string((string *)&local_938);
  cfd::core::Address::~Address(&local_ab0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_918);
  if (!bVar1) {
    testing::Message::Message(&local_ab8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_918);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x21b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_ab8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_ab8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_918);
  pvVar4 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                         *)&script_list2.
                            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_ad4 = cfd::core::DescriptorScriptReference::GetAddressType(pvVar4);
  local_ad8 = kP2wshAddress;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_ad0,"script_list[0].GetAddressType()",
             "AddressType::kP2wshAddress",&local_ad4,&local_ad8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad0);
  if (!bVar1) {
    testing::Message::Message(&local_ae0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ad0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x21c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_ae0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_ae0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad0);
  pvVar4 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                         *)&script_list2.
                            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_afc = cfd::core::DescriptorScriptReference::GetHashType(pvVar4);
  local_b00 = kP2wsh;
  testing::internal::EqHelper<false>::Compare<cfd::core::HashType,cfd::core::HashType>
            ((EqHelper<false> *)local_af8,"script_list[0].GetHashType()","HashType::kP2wsh",
             &local_afc,&local_b00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af8);
  if (!bVar1) {
    testing::Message::Message(&local_b08);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_af8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x21d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_b08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_b08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_af8);
  pvVar4 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                         *)&script_list2.
                            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_b24 = cfd::core::DescriptorScriptReference::GetScriptType(pvVar4);
  local_b28 = kDescriptorScriptWsh;
  testing::internal::EqHelper<false>::
  Compare<cfd::core::DescriptorScriptType,cfd::core::DescriptorScriptType>
            ((EqHelper<false> *)local_b20,"script_list[0].GetScriptType()",
             "DescriptorScriptType::kDescriptorScriptWsh",&local_b24,&local_b28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b20);
  if (!bVar1) {
    testing::Message::Message(&local_b30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x21e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_b30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_b30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b20);
  pvVar4 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                         *)&script_list2.
                            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_b49 = cfd::core::DescriptorScriptReference::HasChild(pvVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b48,&local_b49,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b48);
  if (!bVar1) {
    testing::Message::Message(&local_b58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_9.message_,(internal *)local_b48,
               (AssertionResult *)"script_list[0].HasChild()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x220,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b60,&local_b58);
    testing::internal::AssertHelper::~AssertHelper(&local_b60);
    std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_b58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b48);
  pvVar4 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                         *)&script_list2.
                            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  cfd::core::DescriptorScriptReference::GetRedeemScript(&local_be8,pvVar4);
  cfd::core::Script::ToString_abi_cxx11_(&local_bb0,&local_be8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_b90,"script_list[0].GetRedeemScript().ToString().c_str()",
             "\"1 0205f8f73d8a553ad3287a506dbd53ed176cadeb200c8e4f7d68a001b1aed87106 02c04c4e03921809fcbef9a26da2d62b19b2b4eb383b3e6cfaaef6370e75144774 2 OP_CHECKMULTISIG\""
             ,pcVar2,
             "1 0205f8f73d8a553ad3287a506dbd53ed176cadeb200c8e4f7d68a001b1aed87106 02c04c4e03921809fcbef9a26da2d62b19b2b4eb383b3e6cfaaef6370e75144774 2 OP_CHECKMULTISIG"
            );
  std::__cxx11::string::~string((string *)&local_bb0);
  cfd::core::Script::~Script(&local_be8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b90);
  if (!bVar1) {
    testing::Message::Message(&local_bf0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x222,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_bf0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_bf0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b90);
  pvVar4 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                         *)&script_list2.
                            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  cfd::core::DescriptorScriptReference::GetChild(&local_f60,pvVar4);
  bVar1 = cfd::core::DescriptorScriptReference::HasChild(&local_f60);
  local_c09 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c08,&local_c09,(type *)0x0);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_f60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c08);
  if (!bVar1) {
    testing::Message::Message(&local_f68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_c08,
               (AssertionResult *)"script_list[0].GetChild().HasChild()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x223,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f70,&local_f68);
    testing::internal::AssertHelper::~AssertHelper(&local_f70);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_f68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c08);
  pvVar4 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                         *)&script_list2.
                            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  cfd::core::DescriptorScriptReference::GetChild(&local_12f8,pvVar4);
  local_fa1 = cfd::core::DescriptorScriptReference::HasKey(&local_12f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fa0,&local_fa1,(type *)0x0);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_12f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa0);
  if (!bVar1) {
    testing::Message::Message(&local_1300);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_10.message_,(internal *)local_fa0,
               (AssertionResult *)"script_list[0].GetChild().HasKey()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x224,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1308,&local_1300);
    testing::internal::AssertHelper::~AssertHelper(&local_1308);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fa0);
  pvVar4 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                         *)&script_list2.
                            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  cfd::core::DescriptorScriptReference::GetChild(&local_1690,pvVar4);
  local_133c = cfd::core::DescriptorScriptReference::GetKeyNum(&local_1690);
  local_1694 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_1338,"script_list[0].GetChild().GetKeyNum()","2",&local_133c,
             &local_1694);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_1690);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1338);
  if (!bVar1) {
    testing::Message::Message(&local_16a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &keys.
                super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x225,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &keys.
                super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_16a0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &keys.
                super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_16a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1338);
  pvVar4 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                         *)&script_list2.
                            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  cfd::core::DescriptorScriptReference::GetChild
            ((DescriptorScriptReference *)&gtest_ar_11.message_,pvVar4);
  cfd::core::DescriptorScriptReference::GetKeyList
            ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              *)local_16c0,(DescriptorScriptReference *)&gtest_ar_11.message_);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference
            ((DescriptorScriptReference *)&gtest_ar_11.message_);
  sVar3 = std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::size((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  *)local_16c0);
  if (sVar3 == 2) {
    pvVar5 = std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::operator[]((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                           *)local_16c0,0);
    cfd::core::DescriptorKeyReference::GetPubkey(&local_1a58,pvVar5);
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_1a40,&local_1a58);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1a20,"keys[0].GetPubkey().GetHex().c_str()",
               "\"0205f8f73d8a553ad3287a506dbd53ed176cadeb200c8e4f7d68a001b1aed87106\"",pcVar2,
               "0205f8f73d8a553ad3287a506dbd53ed176cadeb200c8e4f7d68a001b1aed87106");
    std::__cxx11::string::~string((string *)&local_1a40);
    cfd::core::Pubkey::~Pubkey(&local_1a58);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a20);
    if (!bVar1) {
      testing::Message::Message(&local_1a60);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a20);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x229,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_1a60);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
      testing::Message::~Message(&local_1a60);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a20);
    pvVar5 = std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::operator[]((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                           *)local_16c0,0);
    local_1a79 = cfd::core::DescriptorKeyReference::HasExtPubkey(pvVar5);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1a78,&local_1a79,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a78);
    if (!bVar1) {
      testing::Message::Message(&local_1a88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_12.message_,(internal *)local_1a78,
                 (AssertionResult *)"keys[0].HasExtPubkey()","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1a90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x22a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1a90,&local_1a88);
      testing::internal::AssertHelper::~AssertHelper(&local_1a90);
      std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
      testing::Message::~Message(&local_1a88);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a78);
    pvVar5 = std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::operator[]((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                           *)local_16c0,0);
    cfd::core::DescriptorKeyReference::GetExtPubkey(&local_1b50,pvVar5);
    cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_1ae0,&local_1b50);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1ac0,"keys[0].GetExtPubkey().ToString().c_str()",
               "\"xpub6BgWskLoyHmAUeKWgUXCGfDdCMRXseEjRCMEMvjkedmHpnvWtpXMaCRm8qcADw9einPR8o2c49ZpeHRZP4uYwGeMU2T63G7uf2Y1qJavrWQ\""
               ,pcVar2,
               "xpub6BgWskLoyHmAUeKWgUXCGfDdCMRXseEjRCMEMvjkedmHpnvWtpXMaCRm8qcADw9einPR8o2c49ZpeHRZP4uYwGeMU2T63G7uf2Y1qJavrWQ"
              );
    std::__cxx11::string::~string((string *)&local_1ae0);
    cfd::core::ExtPubkey::~ExtPubkey(&local_1b50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ac0);
    if (!bVar1) {
      testing::Message::Message(&local_1b58);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1ac0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x22c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_1b58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
      testing::Message::~Message(&local_1b58);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ac0);
    pvVar5 = std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::operator[]((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                           *)local_16c0,0);
    bVar1 = cfd::core::DescriptorKeyReference::HasExtPrivkey(pvVar5);
    local_1b71 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1b70,&local_1b71,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b70);
    if (!bVar1) {
      testing::Message::Message(&local_1b80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_msg_1,(internal *)local_1b70,
                 (AssertionResult *)"keys[0].HasExtPrivkey()","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1b88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x22d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1b88,&local_1b80);
      testing::internal::AssertHelper::~AssertHelper(&local_1b88);
      std::__cxx11::string::~string((string *)&gtest_msg_1);
      testing::Message::~Message(&local_1b80);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b70);
    testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffe450,"");
    bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                      ((ConstCharPtr *)&stack0xffffffffffffe450);
    if (bVar1) {
      local_1bb1 = 0;
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        pvVar5 = std::
                 vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 ::operator[]((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                               *)local_16c0,0);
        cfd::core::DescriptorKeyReference::GetExtPrivkey((ExtPrivkey *)&anon_var_0_1,pvVar5);
        cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&anon_var_0_1);
      }
      if ((local_1bb1 & 1) == 0) {
        pcStack_1bb0 = 
        "Expected: keys[0].GetExtPrivkey() throws an exception of type CfdException.\n  Actual: it throws nothing."
        ;
        goto LAB_0034d037;
      }
    }
    else {
LAB_0034d037:
      testing::Message::Message(local_1c40);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x22e,pcStack_1bb0);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_1c40);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
      testing::Message::~Message(local_1c40);
    }
    pvVar5 = std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::operator[]((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                           *)local_16c0,0);
    cfd::core::DescriptorKeyReference::GetArgument_abi_cxx11_(&local_1c78,pvVar5);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1c58,"keys[0].GetArgument().c_str()","\"0\"",pcVar2,"0");
    std::__cxx11::string::~string((string *)&local_1c78);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c58);
    if (!bVar1) {
      testing::Message::Message(&local_1c80);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c58);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x22f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_1c80);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
      testing::Message::~Message(&local_1c80);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c58);
    pvVar5 = std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::operator[]((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                           *)local_16c0,1);
    cfd::core::DescriptorKeyReference::GetPubkey(&local_1cd0,pvVar5);
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_1cb8,&local_1cd0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1c98,"keys[1].GetPubkey().GetHex().c_str()",
               "\"02c04c4e03921809fcbef9a26da2d62b19b2b4eb383b3e6cfaaef6370e75144774\"",pcVar2,
               "02c04c4e03921809fcbef9a26da2d62b19b2b4eb383b3e6cfaaef6370e75144774");
    std::__cxx11::string::~string((string *)&local_1cb8);
    cfd::core::Pubkey::~Pubkey(&local_1cd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c98);
    if (!bVar1) {
      testing::Message::Message(&local_1cd8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c98);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x231,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_1cd8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
      testing::Message::~Message(&local_1cd8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c98);
    pvVar5 = std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::operator[]((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                           *)local_16c0,1);
    cfd::core::DescriptorKeyReference::GetExtPubkey(&local_1d80,pvVar5);
    cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_1d10,&local_1d80);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1cf0,"keys[1].GetExtPubkey().ToString().c_str()",
               "\"xpub6EKMC2gSMfKgQJ3iNMZVNB4GLH1Dc4hNPah1iMbbztxdUPRo84MMcTgkPATWNRyzr7WifKrt5VvQi4GEqRwybCP1LHoXBKLN6cB15HuBKPE\""
               ,pcVar2,
               "xpub6EKMC2gSMfKgQJ3iNMZVNB4GLH1Dc4hNPah1iMbbztxdUPRo84MMcTgkPATWNRyzr7WifKrt5VvQi4GEqRwybCP1LHoXBKLN6cB15HuBKPE"
              );
    std::__cxx11::string::~string((string *)&local_1d10);
    cfd::core::ExtPubkey::~ExtPubkey(&local_1d80);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1cf0);
    if (!bVar1) {
      testing::Message::Message(&local_1d88);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1cf0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x233,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_1d88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
      testing::Message::~Message(&local_1d88);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1cf0);
    pvVar5 = std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::operator[]((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                           *)local_16c0,1);
    local_1da4 = cfd::core::DescriptorKeyReference::GetKeyType(pvVar5);
    local_1da8 = kDescriptorKeyBip32;
    testing::internal::EqHelper<false>::
    Compare<cfd::core::DescriptorKeyType,cfd::core::DescriptorKeyType>
              ((EqHelper<false> *)local_1da0,"keys[1].GetKeyType()",
               "DescriptorKeyType::kDescriptorKeyBip32",&local_1da4,&local_1da8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1da0);
    if (!bVar1) {
      testing::Message::Message(&local_1db0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1da0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x234,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_1db0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
      testing::Message::~Message(&local_1db0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1da0);
  }
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_16c0);
LAB_0034d741:
  local_1dd0 = std::
               vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       *)local_278);
  local_1dd4 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_1dc8,"script_list2.size()","1",&local_1dd0,&local_1dd4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1dc8);
  if (!bVar1) {
    testing::Message::Message(&local_1de0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1dc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x238,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_1de0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_1de0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1dc8);
  sVar3 = std::
          vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
          ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)local_278);
  if (sVar3 == 1) {
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_278,0);
    cfd::core::DescriptorScriptReference::GetRedeemScript(&local_1e50,pvVar4);
    cfd::core::Script::ToString_abi_cxx11_(&local_1e18,&local_1e50);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1df8,"script_list2[0].GetRedeemScript().ToString().c_str()",
               "\"1 026e636c42ce086d19aae89eca84e95d568bad8a166b9e99b0e27041caab905f38 02bbd047b8f3dac46297e337fb91043fb7c211be89e6068f156e065ebe7fcca01c 2 OP_CHECKMULTISIG\""
               ,pcVar2,
               "1 026e636c42ce086d19aae89eca84e95d568bad8a166b9e99b0e27041caab905f38 02bbd047b8f3dac46297e337fb91043fb7c211be89e6068f156e065ebe7fcca01c 2 OP_CHECKMULTISIG"
              );
    std::__cxx11::string::~string((string *)&local_1e18);
    cfd::core::Script::~Script(&local_1e50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1df8);
    if (!bVar1) {
      testing::Message::Message(&local_1e58);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1df8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &keys_1.
                  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x23b,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &keys_1.
                  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1e58);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &keys_1.
                  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_1e58);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1df8);
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_278,0);
    cfd::core::DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)&gtest_ar_19.message_,pvVar4);
    cfd::core::DescriptorScriptReference::GetKeyList
              ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                *)local_1e78,(DescriptorScriptReference *)&gtest_ar_19.message_);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)&gtest_ar_19.message_);
    sVar3 = std::
            vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            ::size((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                    *)local_1e78);
    if (sVar3 == 2) {
      pvVar5 = std::
               vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
               ::operator[]((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                             *)local_1e78,0);
      cfd::core::DescriptorKeyReference::GetArgument_abi_cxx11_(&local_21f8,pvVar5);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::CmpHelperSTREQ
                ((internal *)local_21d8,"keys[0].GetArgument().c_str()","\"0/44\"",pcVar2,"0/44");
      std::__cxx11::string::~string((string *)&local_21f8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_21d8);
      if (!bVar1) {
        testing::Message::Message(&local_2200);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_21d8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &addresses.
                    super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                   ,0x23e,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &addresses.
                    super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&local_2200);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   &addresses.
                    super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_2200);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_21d8);
    }
    pvVar4 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_278,0);
    cfd::core::DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)&gtest_ar_20.message_,pvVar4);
    cfd::core::DescriptorScriptReference::GenerateAddresses
              ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)local_2220,
               (DescriptorScriptReference *)&gtest_ar_20.message_,kMainnet);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)&gtest_ar_20.message_);
    local_2588 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::size
                           ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                            local_2220);
    local_258c = 2;
    testing::internal::EqHelper<false>::Compare<unsigned_long,int>
              ((EqHelper<false> *)local_2580,"addresses.size()","2",&local_2588,&local_258c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2580);
    if (!bVar1) {
      testing::Message::Message(&local_2598);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2580);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x242,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_2598);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
      testing::Message::~Message(&local_2598);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2580);
    sVar3 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::size
                      ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)local_2220
                      );
    if (sVar3 == 2) {
      pvVar6 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                         ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                          local_2220,0);
      cfd::core::Address::GetAddress_abi_cxx11_(&local_25d0,pvVar6);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::CmpHelperSTREQ
                ((internal *)local_25b0,"addresses[0].GetAddress().c_str()",
                 "\"13HW6r2TPu5MULn8Do8TpvZs2qeARv1ZBA\"",pcVar2,
                 "13HW6r2TPu5MULn8Do8TpvZs2qeARv1ZBA");
      std::__cxx11::string::~string((string *)&local_25d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_25b0);
      if (!bVar1) {
        testing::Message::Message(&local_25d8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_25b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                   ,0x245,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_22.message_,&local_25d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
        testing::Message::~Message(&local_25d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_25b0);
      pvVar6 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                         ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                          local_2220,1);
      cfd::core::Address::GetAddress_abi_cxx11_(&local_2610,pvVar6);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::CmpHelperSTREQ
                ((internal *)local_25f0,"addresses[1].GetAddress().c_str()",
                 "\"17jeEcwRN7u1W9KoRwpHFbCyyij478uvXF\"",pcVar2,
                 "17jeEcwRN7u1W9KoRwpHFbCyyij478uvXF");
      std::__cxx11::string::~string((string *)&local_2610);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_25f0);
      if (!bVar1) {
        testing::Message::Message(&local_2618);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_25f0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2620,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                   ,0x247,pcVar2);
        testing::internal::AssertHelper::operator=(&local_2620,&local_2618);
        testing::internal::AssertHelper::~AssertHelper(&local_2620);
        testing::Message::~Message(&local_2618);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_25f0);
    }
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
              ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)local_2220);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_1e78);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_438);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&arg_list2.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             *)local_278);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             *)&script_list2.
                super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script
            ((Script *)
             &script_list.
              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_208);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_wsh_extkey_derive) {
  std::string descriptor = "wsh(multi(1,xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/*,xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*))";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  Script gen_script;
  std::vector<DescriptorScriptReference> script_list;
  std::vector<DescriptorScriptReference> script_list2;

  try {
    desc = Descriptor::Parse(descriptor);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
  std::vector<std::string> arg_list1;
  std::vector<std::string> arg_list2;
  arg_list1.push_back("0");
  arg_list1.push_back("0");
  arg_list2.push_back("0/44");
  arg_list2.push_back("0/44");
  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_THROW(locking_script = desc.GetLockingScript(), CfdException);
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript("0"));
  EXPECT_NO_THROW(gen_script = desc.GetLockingScript(arg_list2));
  EXPECT_NO_THROW(script_list = desc.GetReferenceAll(&arg_list1));
  EXPECT_NO_THROW(script_list2 = desc.GetReferenceAll(&arg_list2));
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
    "0 64969d8cdca2aa0bb72cfe88427612878db98a5f07f9a7ec6ec87b85e9f9208b");
  EXPECT_STREQ(gen_script.ToString().c_str(),
    "0 2070830c75de894b00286a87cbbb201aaec3487b5891dbf657c0500e11efa27d");

  EXPECT_EQ(script_list.size(), 1);
  if (script_list.size() == 1) {
    EXPECT_TRUE(script_list[0].HasAddress());
    EXPECT_STREQ(script_list[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str(),
      "bc1qvjtfmrxu524qhdevl6yyyasjs7xmnzjlqlu60mrwepact60eyz9s9xjw0c");
    EXPECT_EQ(script_list[0].GetAddressType(), AddressType::kP2wshAddress);
    EXPECT_EQ(script_list[0].GetHashType(), HashType::kP2wsh);
    EXPECT_EQ(script_list[0].GetScriptType(), DescriptorScriptType::kDescriptorScriptWsh);

    EXPECT_TRUE(script_list[0].HasChild());
    EXPECT_STREQ(script_list[0].GetRedeemScript().ToString().c_str(),
      "1 0205f8f73d8a553ad3287a506dbd53ed176cadeb200c8e4f7d68a001b1aed87106 02c04c4e03921809fcbef9a26da2d62b19b2b4eb383b3e6cfaaef6370e75144774 2 OP_CHECKMULTISIG");
    EXPECT_FALSE(script_list[0].GetChild().HasChild());
    EXPECT_TRUE(script_list[0].GetChild().HasKey());
    EXPECT_EQ(script_list[0].GetChild().GetKeyNum(), 2);
    std::vector<DescriptorKeyReference> keys = script_list[0].GetChild().GetKeyList();
    if (keys.size() == 2) {
      EXPECT_STREQ(keys[0].GetPubkey().GetHex().c_str(),
        "0205f8f73d8a553ad3287a506dbd53ed176cadeb200c8e4f7d68a001b1aed87106");
      EXPECT_TRUE(keys[0].HasExtPubkey());
      EXPECT_STREQ(keys[0].GetExtPubkey().ToString().c_str(),
        "xpub6BgWskLoyHmAUeKWgUXCGfDdCMRXseEjRCMEMvjkedmHpnvWtpXMaCRm8qcADw9einPR8o2c49ZpeHRZP4uYwGeMU2T63G7uf2Y1qJavrWQ");
      EXPECT_FALSE(keys[0].HasExtPrivkey());
      EXPECT_THROW(keys[0].GetExtPrivkey(), CfdException);
      EXPECT_STREQ(keys[0].GetArgument().c_str(), "0");
      EXPECT_STREQ(keys[1].GetPubkey().GetHex().c_str(),
        "02c04c4e03921809fcbef9a26da2d62b19b2b4eb383b3e6cfaaef6370e75144774");
      EXPECT_STREQ(keys[1].GetExtPubkey().ToString().c_str(),
        "xpub6EKMC2gSMfKgQJ3iNMZVNB4GLH1Dc4hNPah1iMbbztxdUPRo84MMcTgkPATWNRyzr7WifKrt5VvQi4GEqRwybCP1LHoXBKLN6cB15HuBKPE");
      EXPECT_EQ(keys[1].GetKeyType(), DescriptorKeyType::kDescriptorKeyBip32);
    }
  }

  EXPECT_EQ(script_list2.size(), 1);
  if (script_list2.size() == 1) {
    EXPECT_STREQ(script_list2[0].GetRedeemScript().ToString().c_str(),
      "1 026e636c42ce086d19aae89eca84e95d568bad8a166b9e99b0e27041caab905f38 02bbd047b8f3dac46297e337fb91043fb7c211be89e6068f156e065ebe7fcca01c 2 OP_CHECKMULTISIG");
    std::vector<DescriptorKeyReference> keys = script_list2[0].GetChild().GetKeyList();
    if (keys.size() == 2) {
      EXPECT_STREQ(keys[0].GetArgument().c_str(), "0/44");
    }
    std::vector<Address> addresses = script_list2[0].GetChild()
        .GenerateAddresses(NetType::kMainnet);
    EXPECT_EQ(addresses.size(), 2);
    if (addresses.size() == 2) {
      EXPECT_STREQ(addresses[0].GetAddress().c_str(),
          "13HW6r2TPu5MULn8Do8TpvZs2qeARv1ZBA");
      EXPECT_STREQ(addresses[1].GetAddress().c_str(),
          "17jeEcwRN7u1W9KoRwpHFbCyyij478uvXF");
    }
  }
}